

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O1

void __thiscall
ExprTest_EqualLogicalCountExpr_Test::TestBody(ExprTest_EqualLogicalCountExpr_Test *this)

{
  ExprFactory *this_00;
  bool bVar1;
  NumericConstant lhs;
  NumericConstant lhs_00;
  CountExpr rhs;
  LogicalCountExpr LVar2;
  LogicalCountExpr LVar3;
  char *in_R9;
  AssertionResult gtest_ar_;
  LogicalExpr args [1];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  AssertHelper local_68;
  internal local_60 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  string local_50;
  ExprBase local_30;
  
  this_00 = &(this->super_ExprTest).factory_;
  lhs = mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant(this_00,0.0);
  lhs_00 = mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant(this_00,1.0);
  local_30.impl_ = (this->super_ExprTest).l0.super_ExprBase.impl_;
  rhs = ExprTest::MakeCount<1>(&this->super_ExprTest,(LogicalExpr (*) [1])&local_30);
  LVar2 = mp::BasicExprFactory<std::allocator<char>>::
          MakeBinary<mp::LogicalCountExpr,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)47,(mp::expr::Kind)47>>
                    ((BasicExprFactory<std::allocator<char>> *)this_00,ATMOST,
                     (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)
                     lhs.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_,
                     (BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>
                      )rhs.super_BasicExpr<(mp::expr::Kind)47,_(mp::expr::Kind)47>.super_ExprBase.
                       impl_);
  LVar3 = mp::BasicExprFactory<std::allocator<char>>::
          MakeBinary<mp::LogicalCountExpr,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)47,(mp::expr::Kind)47>>
                    ((BasicExprFactory<std::allocator<char>> *)this_00,ATMOST,
                     (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)
                     lhs.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_,
                     (BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>
                      )rhs.super_BasicExpr<(mp::expr::Kind)47,_(mp::expr::Kind)47>.super_ExprBase.
                       impl_);
  local_60[0] = (internal)
                mp::Equal((Expr)LVar2.super_BasicExpr<(mp::expr::Kind)59,_(mp::expr::Kind)64>.
                                super_ExprBase.impl_,
                          (Expr)LVar3.super_BasicExpr<(mp::expr::Kind)59,_(mp::expr::Kind)64>.
                                super_ExprBase.impl_);
  local_58.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_60[0]) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_50,local_60,
               (AssertionResult *)
               "Equal(factory_.MakeLogicalCount(expr::ATMOST, n0, count), factory_.MakeLogicalCount(expr::ATMOST, n0, count))"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x375
               ,local_50._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (local_70.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_70.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_70.ptr_ + 8))();
      }
      local_70.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  LVar2 = mp::BasicExprFactory<std::allocator<char>>::
          MakeBinary<mp::LogicalCountExpr,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)47,(mp::expr::Kind)47>>
                    ((BasicExprFactory<std::allocator<char>> *)this_00,ATMOST,
                     (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)
                     lhs.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_,
                     (BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>
                      )rhs.super_BasicExpr<(mp::expr::Kind)47,_(mp::expr::Kind)47>.super_ExprBase.
                       impl_);
  LVar3 = mp::BasicExprFactory<std::allocator<char>>::
          MakeBinary<mp::LogicalCountExpr,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)47,(mp::expr::Kind)47>>
                    ((BasicExprFactory<std::allocator<char>> *)this_00,ATMOST,
                     (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)
                     lhs_00.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.
                     impl_,(BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>
                            )rhs.super_BasicExpr<(mp::expr::Kind)47,_(mp::expr::Kind)47>.
                             super_ExprBase.impl_);
  bVar1 = mp::Equal((Expr)LVar2.super_BasicExpr<(mp::expr::Kind)59,_(mp::expr::Kind)64>.
                          super_ExprBase.impl_,
                    (Expr)LVar3.super_BasicExpr<(mp::expr::Kind)59,_(mp::expr::Kind)64>.
                          super_ExprBase.impl_);
  local_60[0] = (internal)!bVar1;
  local_58.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_60[0]) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_50,local_60,
               (AssertionResult *)
               "Equal(factory_.MakeLogicalCount(expr::ATMOST, n0, count), factory_.MakeLogicalCount(expr::ATMOST, n1, count))"
               ,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x377
               ,local_50._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (local_70.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_70.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_70.ptr_ + 8))();
      }
      local_70.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(ExprTest, EqualLogicalCountExpr) {
  auto n0 = MakeConst(0), n1 = MakeConst(1);
  LogicalExpr args[] = {l0};
  auto count = MakeCount(args);
  EXPECT_TRUE(Equal(factory_.MakeLogicalCount(expr::ATMOST, n0, count),
                    factory_.MakeLogicalCount(expr::ATMOST, n0, count)));
  EXPECT_FALSE(Equal(factory_.MakeLogicalCount(expr::ATMOST, n0, count),
                     factory_.MakeLogicalCount(expr::ATMOST, n1, count)));
}